

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DynamicType * __thiscall
Js::JavascriptLibrary::GetObjectHeaderInlinedLiteralType
          (JavascriptLibrary *this,uint16 requestedInlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  PropertyIndex PVar4;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  
  PVar3 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
  if (PVar3 + 0x10 < (uint)CONCAT62(in_register_00000032,requestedInlineSlotCapacity)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1707,
                                "(requestedInlineSlotCapacity <= (Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() + 16))"
                                ,
                                "requestedInlineSlotCapacity <= MaxPreInitializedObjectHeaderInlinedTypeInlineSlotCount"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  PVar3 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                    (requestedInlineSlotCapacity);
  PVar4 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
  return *(DynamicType **)
          ((long)&this->objectHeaderInlinedTypes[0].ptr +
          ((ulong)PVar3 - (ulong)PVar4 & 0xfffffffffffffffe) * 4);
}

Assistant:

DynamicType * JavascriptLibrary::GetObjectHeaderInlinedLiteralType(uint16 requestedInlineSlotCapacity)
    {
        Assert(requestedInlineSlotCapacity <= MaxPreInitializedObjectHeaderInlinedTypeInlineSlotCount);

        return
            objectHeaderInlinedTypes[
                (
                    DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity) -
                    DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
                    ) / InlineSlotCountIncrement];
    }